

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection_yolo.cpp
# Opt level: O0

void drawPred(int classId,float conf,int left,int top,int right,int bottom,Mat *frame)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference __rhs;
  int *piVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [12];
  Scalar_<double> local_1a0;
  Point_<int> local_180;
  _InputOutputArray local_178;
  Scalar_<double> local_160;
  Point_<int> local_140;
  Point_<int> local_138;
  _InputOutputArray local_130;
  int local_114;
  int local_110;
  Size labelSize;
  int baseLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [39];
  allocator local_c1;
  string local_c0 [32];
  string local_a0 [8];
  string label;
  Scalar_<double> local_80;
  Point_<int> local_5c;
  undefined4 local_54;
  undefined8 local_50;
  Point_<int> local_48;
  _InputOutputArray local_40;
  Mat *local_28;
  Mat *frame_local;
  int bottom_local;
  int right_local;
  int top_local;
  int left_local;
  float conf_local;
  int classId_local;
  
  local_28 = frame;
  frame_local._0_4_ = bottom;
  frame_local._4_4_ = right;
  bottom_local = top;
  right_local = left;
  top_local = (int)conf;
  left_local = classId;
  cv::_InputOutputArray::_InputOutputArray(&local_40,frame);
  cv::Point_<int>::Point_(&local_48,right_local,bottom_local);
  cv::Point_<int>::Point_(&local_5c,frame_local._4_4_,(int)frame_local);
  cv::Scalar_<double>::Scalar_(&local_80,255.0,178.0,50.0,0.0);
  cv::rectangle(&local_40,&local_48,&local_5c,&local_80,3,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_40);
  cv::format_abi_cxx11_((char *)local_a0,(double)(float)top_local,"%.2f");
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&classes_abi_cxx11_);
  iVar1 = left_local;
  if (!bVar2) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&classes_abi_cxx11_);
    if ((int)sVar3 <= iVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"classId < (int)classes.size()",&local_c1);
      auVar7 = cv::error(-0xd7,local_c0,"drawPred",
                         "/workspace/llm4binary/github/license_c_cmakelists/madhu-korada[P]YOLO-IOU-cpp/object_detection_yolo.cpp"
                         ,0x1bc);
      local_54 = auVar7._8_4_;
      local_50 = auVar7._0_8_;
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      std::__cxx11::string::~string(local_a0);
      _Unwind_Resume(local_50);
    }
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&classes_abi_cxx11_,(long)left_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &labelSize.height,(char *)__rhs);
    std::operator+(local_e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &labelSize.height);
    std::__cxx11::string::operator=(local_a0,(string *)local_e8);
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string((string *)&labelSize.height);
  }
  cv::getTextSize((string *)&local_114,(int)local_a0,0.5,0,(int *)0x1);
  piVar4 = std::max<int>(&bottom_local,&local_110);
  bottom_local = *piVar4;
  cv::_InputOutputArray::_InputOutputArray(&local_130,local_28);
  iVar1 = right_local;
  dVar5 = (double)bottom_local;
  dVar6 = round((double)local_110);
  cv::Point_<int>::Point_(&local_138,iVar1,(int)(dVar5 - dVar6));
  dVar5 = (double)right_local;
  dVar6 = round((double)local_114);
  cv::Point_<int>::Point_(&local_140,(int)(dVar5 + dVar6),bottom_local + labelSize.width);
  cv::Scalar_<double>::Scalar_(&local_160,255.0,255.0,255.0,0.0);
  cv::rectangle(&local_130,&local_138,&local_140,&local_160,0xffffffff,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_130);
  cv::_InputOutputArray::_InputOutputArray(&local_178,local_28);
  cv::Point_<int>::Point_(&local_180,right_local,bottom_local);
  cv::Scalar_<double>::Scalar_(&local_1a0,0.0,0.0,0.0,0.0);
  cv::putText(0x3fe0000000000000,&local_178,local_a0,&local_180,0,&local_1a0,1,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_178);
  std::__cxx11::string::~string(local_a0);
  return;
}

Assistant:

void drawPred(int classId, float conf, int left, int top, int right, int bottom, cv::Mat& frame)
{
    //Draw a rectangle displaying the bounding box
    cv::rectangle(frame, cv::Point(left, top), cv::Point(right, bottom), cv::Scalar(255, 178, 50), 3);
    
    //Get the label for the class name and its confidence
    std::string label = cv::format("%.2f", conf);
    if (!classes.empty())
    {
        CV_Assert(classId < (int)classes.size());
        label = classes[classId] + ":" + label;
    }
    
    //Display the label at the top of the bounding box
    int baseLine;
    cv::Size labelSize = cv::getTextSize(label, cv::FONT_HERSHEY_SIMPLEX, 0.5, 1, &baseLine);
    top = cv::max(top, labelSize.height);
    cv::rectangle(frame, cv::Point(left, top - round(1*labelSize.height)), cv::Point(left + round(1*labelSize.width), top + baseLine), cv::Scalar(255, 255, 255), cv::FILLED);
    cv::putText(frame, label, cv::Point(left, top), cv::FONT_HERSHEY_SIMPLEX, 0.5, cv::Scalar(0,0,0),1);
}